

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.hpp
# Opt level: O1

void __thiscall
Diligent::ShaderCodeVariableDescX::SetDefaultTypeName
          (ShaderCodeVariableDescX *this,SHADER_SOURCE_LANGUAGE Language)

{
  SHADER_SOURCE_LANGUAGE in_stack_ffffffffffffffc8;
  string local_30;
  
  GetShaderCodeTypeName_abi_cxx11_
            (&local_30,(Diligent *)(ulong)(this->super_ShaderCodeVariableDesc).BasicType,
             (this->super_ShaderCodeVariableDesc).Class,(this->super_ShaderCodeVariableDesc).NumRows
             ,(uint)(this->super_ShaderCodeVariableDesc).NumColumns,Language,
             in_stack_ffffffffffffffc8);
  std::__cxx11::string::operator=((string *)&this->TypeNameCopy,(string *)&local_30);
  (this->super_ShaderCodeVariableDesc).TypeName = (this->TypeNameCopy)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SetDefaultTypeName(SHADER_SOURCE_LANGUAGE Language)
    {
        SetTypeName(GetShaderCodeTypeName(BasicType, Class, NumRows, NumColumns, Language));
    }